

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
          (SACSubcaseBase *this,char *src_vs,char *src_tcs,char *src_tes,char *src_gs,char *src_fs,
          bool link)

{
  CallLogWrapper *this_00;
  GLuint program;
  GLuint GVar1;
  char local_5c;
  char *src_fs_local;
  char *src_gs_local;
  char *src_tes_local;
  char *src_vs_local;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  src_fs_local = src_gs;
  src_gs_local = src_tes;
  src_tes_local = src_tcs;
  src_vs_local = src_vs;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (src_vs != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&src_vs_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  }
  if (src_tcs != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8e87);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&src_tes_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  }
  if (src_tes != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8dd9);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&src_gs_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  }
  if (src_gs != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&src_fs_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  }
  local_5c = (char)src_fs;
  if (local_5c != '\0') {
    LinkProgram(this,program);
  }
  return program;
}

Assistant:

GLuint CreateProgram(const char* src_vs, const char* src_tcs, const char* src_tes, const char* src_gs,
						 const char* src_fs, bool link)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			glCompileShader(sh);
		}
		if (src_tcs)
		{
			GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tcs, NULL);
			glCompileShader(sh);
		}
		if (src_tes)
		{
			GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tes, NULL);
			glCompileShader(sh);
		}
		if (src_gs)
		{
			GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_gs, NULL);
			glCompileShader(sh);
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			glCompileShader(sh);
		}
		if (link)
		{
			LinkProgram(p);
		}
		return p;
	}